

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O0

void __thiscall Rml::DataView::DataView(DataView *this,Element *element,int bias)

{
  code *pcVar1;
  bool bVar2;
  Element *local_38;
  Element *parent;
  int bias_local;
  Element *element_local;
  DataView *this_local;
  
  Releasable::Releasable(&this->super_Releasable);
  (this->super_Releasable)._vptr_Releasable = (_func_int **)&PTR__DataView_008153b0;
  EnableObserverPtr<Rml::Element>::GetObserverPtr
            ((EnableObserverPtr<Rml::Element> *)&this->attached_element);
  this->sort_order = bias + 1000;
  if (((bias < -1000) || (999 < bias)) &&
     (bVar2 = Assert("RMLUI_ASSERT(bias >= -1000 && bias <= 999)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataView.cpp"
                     ,0x39), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (element != (Element *)0x0) {
    for (local_38 = Element::GetParentNode(element); local_38 != (Element *)0x0;
        local_38 = Element::GetParentNode(local_38)) {
      this->sort_order = this->sort_order + 2000;
    }
  }
  return;
}

Assistant:

DataView::DataView(Element* element, int bias) : attached_element(element->GetObserverPtr()), sort_order(bias + 1000)
{
	RMLUI_ASSERT(bias >= -1000 && bias <= 999);

	if (element)
	{
		for (Element* parent = element->GetParentNode(); parent; parent = parent->GetParentNode())
			sort_order += 2000;
	}
}